

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

int __thiscall CGlyphMap::GetCharGlyph(CGlyphMap *this,int Chr,FT_Face_conflict *pFace)

{
  int iVar1;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  int GlyphIndex;
  int local_28;
  int local_4;
  
  local_4 = FT_Get_Char_Index(*(undefined8 *)(in_RDI + 0x338),(long)in_ESI);
  *in_RDX = *(undefined8 *)(in_RDI + 0x338);
  if ((*(long *)(in_RDI + 0x338) != 0) && (local_4 == 0)) {
    if ((*(long *)(in_RDI + 0x340) == 0) ||
       (local_4 = FT_Get_Char_Index(*(undefined8 *)(in_RDI + 0x340),(long)in_ESI), local_4 == 0)) {
      for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x3c8); local_28 = local_28 + 1) {
        if ((*(long *)(in_RDI + 0x348 + (long)local_28 * 8) != 0) &&
           (iVar1 = FT_Get_Char_Index(*(undefined8 *)(in_RDI + 0x348 + (long)local_28 * 8),
                                      (long)in_ESI), iVar1 != 0)) {
          *in_RDX = *(undefined8 *)(in_RDI + 0x348 + (long)local_28 * 8);
          return iVar1;
        }
      }
      local_4 = 0;
    }
    else {
      *in_RDX = *(undefined8 *)(in_RDI + 0x340);
    }
  }
  return local_4;
}

Assistant:

int CGlyphMap::GetCharGlyph(int Chr, FT_Face *pFace)
{
	int GlyphIndex = FT_Get_Char_Index(m_DefaultFace, (FT_ULong)Chr);
	*pFace = m_DefaultFace;

	if(!m_DefaultFace || GlyphIndex)
		return GlyphIndex;

	if(m_VariantFace)
	{
		GlyphIndex = FT_Get_Char_Index(m_VariantFace, (FT_ULong)Chr);
		if(GlyphIndex)
		{
			*pFace = m_VariantFace;
			return GlyphIndex;
		}
	}

	for(int i = 0; i < m_NumFallbackFaces; ++i)
	{
		if(m_aFallbackFaces[i])
		{
			GlyphIndex = FT_Get_Char_Index(m_aFallbackFaces[i], (FT_ULong)Chr);
			if(GlyphIndex)
			{
				*pFace = m_aFallbackFaces[i];
				return GlyphIndex;
			}
		}
	}

	return 0;
}